

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cpp
# Opt level: O0

NodesSeq<dg::dda::RWNode> * __thiscall
dg::dda::LLVMReadWriteGraphBuilder::createCall(LLVMReadWriteGraphBuilder *this,Instruction *Inst)

{
  initializer_list<const_llvm::Function_*> __l;
  bool bVar1;
  ret_type pFVar2;
  RWNode *this_00;
  raw_ostream *in_RSI;
  NodesSeq<dg::dda::RWNode> *in_RDI;
  CallInst *in_stack_00000040;
  LLVMReadWriteGraphBuilder *in_stack_00000048;
  vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *functions;
  Function *function;
  CallInst *in_stack_000000a8;
  vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *in_stack_000000b0;
  LLVMReadWriteGraphBuilder *in_stack_000000b8;
  Value *calledVal;
  CallInst *CInst;
  NodesSeq<dg::dda::RWNode> *__a;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  NodesSeq<dg::dda::RWNode> *in_stack_ffffffffffffff40;
  ValInfo local_a8 [3];
  LLVMPointerAnalysis *in_stack_ffffffffffffff70;
  Value *in_stack_ffffffffffffff78;
  ValInfo *in_stack_ffffffffffffff88;
  raw_ostream *in_stack_ffffffffffffff90;
  RWNode *local_40;
  RWNode **local_38;
  undefined8 local_30;
  Value *local_28;
  ret_type local_20;
  
  __a = in_RDI;
  local_20 = llvm::cast<llvm::CallInst,llvm::Instruction_const>((Instruction *)0x18dda6);
  llvm::CallBase::getCalledOperand((CallBase *)0x18ddbb);
  local_28 = llvm::Value::stripPointerCasts((Value *)0x18ddc3);
  bVar1 = llvm::CallBase::isInlineAsm((CallBase *)in_RDI);
  if (bVar1) {
    if ((createCall::warned_inline_assembly & 1U) == 0) {
      llvm::errs();
      llvm::raw_ostream::operator<<(in_RSI,(char *)__a);
      createCall::warned_inline_assembly = true;
    }
    local_40 = createUnknownCall(in_stack_00000048,in_stack_00000040);
    local_38 = &local_40;
    local_30 = 1;
    NodesSeq<dg::dda::RWNode>::NodesSeq
              (in_stack_ffffffffffffff40,
               (initializer_list<dg::dda::RWNode_*> *)
               CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  }
  else {
    pFVar2 = llvm::dyn_cast<llvm::Function,llvm::Value_const>((Value *)in_RDI);
    if (pFVar2 == (ret_type)0x0) {
      getCalledFunctions(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      bVar1 = std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::empty
                        ((vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *)
                         in_RSI);
      if (bVar1) {
        llvm::errs();
        llvm::raw_ostream::operator<<(in_RSI,(char *)__a);
        ValInfo::ValInfo(local_a8,(Value *)local_20);
        operator<<(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        llvm::raw_ostream::operator<<(in_RSI,(char *)__a);
        this_00 = createUnknownCall(in_stack_00000048,in_stack_00000040);
        NodesSeq<dg::dda::RWNode>::NodesSeq
                  ((NodesSeq<dg::dda::RWNode> *)this_00,
                   (initializer_list<dg::dda::RWNode_*> *)
                   CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      }
      else {
        createCallToFunctions(in_stack_000000b8,in_stack_000000b0,in_stack_000000a8);
      }
      std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::~vector
                ((vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *)in_RSI);
    }
    else {
      std::allocator<const_llvm::Function_*>::allocator
                ((allocator<const_llvm::Function_*> *)0x18dea0);
      __l._M_array._4_4_ = in_stack_ffffffffffffff3c;
      __l._M_array._0_4_ = in_stack_ffffffffffffff38;
      __l._M_len = (size_type)in_stack_ffffffffffffff40;
      std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::vector
                ((vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *)in_RSI,
                 __l,(allocator_type *)__a);
      createCallToFunctions(in_stack_000000b8,in_stack_000000b0,in_stack_000000a8);
      std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::~vector
                ((vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *)in_RSI);
      std::allocator<const_llvm::Function_*>::~allocator
                ((allocator<const_llvm::Function_*> *)0x18def5);
    }
  }
  return __a;
}

Assistant:

NodesSeq<RWNode>
LLVMReadWriteGraphBuilder::createCall(const llvm::Instruction *Inst) {
    using namespace llvm;
    const CallInst *CInst = cast<CallInst>(Inst);
#if LLVM_VERSION_MAJOR >= 8
    const Value *calledVal = CInst->getCalledOperand()->stripPointerCasts();
#else
    const Value *calledVal = CInst->getCalledValue()->stripPointerCasts();
#endif
    static bool warned_inline_assembly = false;

    if (CInst->isInlineAsm()) {
        if (!warned_inline_assembly) {
            llvm::errs() << "[RWG] WARNING: Inline assembler found\n";
            warned_inline_assembly = true;
        }
        return {createUnknownCall(CInst)};
    }

    if (const Function *function = dyn_cast<Function>(calledVal)) {
        return createCallToFunctions({function}, CInst);
    }

    const auto &functions = getCalledFunctions(calledVal, PTA);
    if (functions.empty()) {
        llvm::errs() << "[RWG] error: could not determine the called function "
                        "in a call via pointer: \n"
                     << ValInfo(CInst) << "\n";
        return {createUnknownCall(CInst)};
    }
    return createCallToFunctions(functions, CInst);
}